

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O3

void __thiscall
pzgeom::TPZTriangleTorus::GradX<double>
          (TPZTriangleTorus *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double dVar1;
  double dVar2;
  int64_t iVar3;
  int64_t iVar4;
  double *pdVar5;
  TPZManVector<double,_3> ft;
  TPZFNMatrix<6,_double> DxDphi;
  TPZFNMatrix<6,_double> gradphi;
  TPZManVector<double,_3> local_200;
  TPZFMatrix<double> local_1c8;
  double local_138 [7];
  double local_100;
  TPZFMatrix<double> local_f8;
  double local_68 [7];
  
  local_1c8.fElem = local_138;
  local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01883a30;
  local_1c8.fSize = 6;
  local_1c8.fGiven = local_1c8.fElem;
  TPZVec<int>::TPZVec(&local_1c8.fPivot.super_TPZVec<int>,0);
  local_1c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1c8.fPivot.super_TPZVec<int>.fStore = local_1c8.fPivot.fExtAlloc;
  local_1c8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1c8.fWork.fStore = (double *)0x0;
  local_1c8.fWork.fNElements = 0;
  local_1c8.fWork.fNAlloc = 0;
  local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01883740;
  TPZFMatrix<double>::operator=(&local_1c8,0.0);
  local_f8.fElem = local_68;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01883a30;
  local_f8.fSize = 6;
  local_f8.fGiven = local_f8.fElem;
  TPZVec<int>::TPZVec(&local_f8.fPivot.super_TPZVec<int>,0);
  local_f8.fPivot.super_TPZVec<int>.fStore = local_f8.fPivot.fExtAlloc;
  local_f8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_f8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_f8.fWork.fStore = (double *)0x0;
  local_f8.fWork.fNElements = 0;
  local_f8.fWork.fNAlloc = 0;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01883740;
  local_100 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_200,3,&local_100);
  TPZGeoTriangle::X<double>
            (&(this->fPhiTheta).super_TPZFMatrix<double>,par,&local_200.super_TPZVec<double>);
  TPZGeoTriangle::GradX<double>(&(this->fPhiTheta).super_TPZFMatrix<double>,par,&local_f8);
  dVar1 = cos(local_200.super_TPZVec<double>.fStore[1]);
  dVar2 = sin(*local_200.super_TPZVec<double>.fStore);
  if ((local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_1c8.fElem = dVar2 * -dVar1;
  dVar1 = cos(*local_200.super_TPZVec<double>.fStore);
  dVar2 = sin(local_200.super_TPZVec<double>.fStore[1]);
  if ((local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_1c8.fElem[local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] =
       dVar2 * -(dVar1 + 3.0);
  dVar1 = sin(local_200.super_TPZVec<double>.fStore[1]);
  dVar2 = sin(*local_200.super_TPZVec<double>.fStore);
  if ((local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_1c8.fElem[1] = dVar2 * -dVar1;
  dVar1 = cos(local_200.super_TPZVec<double>.fStore[1]);
  dVar2 = cos(*local_200.super_TPZVec<double>.fStore);
  if ((1 < local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (1 < local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_1c8.fElem[local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] =
         dVar1 * (dVar2 + 3.0);
    dVar1 = cos(*local_200.super_TPZVec<double>.fStore);
    pdVar5 = local_1c8.fElem;
    iVar4 = local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
    iVar3 = local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
    if (local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1 ||
        local_1c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_1c8.fElem[2] = dVar1;
    if (iVar4 < 2) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar5[iVar3 + 2] = 0.0;
    TPZMatrix<double>::Multiply(&local_1c8.super_TPZMatrix<double>,&local_f8,gradx,0);
    TPZManVector<double,_3>::~TPZManVector(&local_200);
    TPZFMatrix<double>::~TPZFMatrix(&local_f8,&PTR_PTR_018839f8);
    TPZFMatrix<double>::~TPZFMatrix(&local_1c8,&PTR_PTR_018839f8);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            TPZFNMatrix<6,T> DxDphi(3,2,0.), gradphi(2,2);
            TPZManVector<T,3> ft(3,0.);
            TPZGeoTriangle::X(fPhiTheta,par,ft);
            TPZGeoTriangle::GradX(fPhiTheta, par, gradphi);
            
            DxDphi(0,0) = -cos(ft[1]) * sin(ft[0]);
            DxDphi(0,1) = -(3. + cos(ft[0])) * sin(ft[1]);
            DxDphi(1,0) = -sin(ft[1]) * sin(ft[0]);
            DxDphi(1,1) = cos(ft[1]) * (3. + cos(ft[0]));
            DxDphi(2,0) = cos(ft[0]);
            DxDphi(2,1) = 0.;
            DxDphi.Multiply(gradphi, gradx);

            
        }